

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

margin_line<plot::Frame<plot::BrailleCanvas_*>_> * __thiscall
plot::detail::margin_line<plot::Frame<plot::BrailleCanvas_*>_>::next
          (margin_line<plot::Frame<plot::BrailleCanvas_*>_> *__return_storage_ptr__,
          margin_line<plot::Frame<plot::BrailleCanvas_*>_> *this)

{
  long lVar1;
  Margin<plot::Frame<plot::BrailleCanvas_*>_> *pMVar2;
  Frame<plot::BrailleCanvas_*> *pFVar3;
  BrailleCanvas *pBVar4;
  BrailleCanvas *pBVar5;
  block_t *pbVar6;
  ptrdiff_t pVar7;
  Frame<plot::BrailleCanvas_*> *pFVar8;
  BrailleCanvas *pBVar9;
  block_t *pbVar10;
  block_t *pbVar11;
  block_t *pbVar12;
  long lVar13;
  
  lVar1 = this->overflow_;
  if (lVar1 == 0) {
    lVar13 = (this->line_).line_.overflow_;
    pbVar12 = (this->line_).line_.line_.line_.it_._M_current;
    if ((pbVar12 != (this->end_).line_.line_.line_.it_._M_current) ||
       (lVar13 != (this->end_).line_.overflow_)) {
      pMVar2 = this->margin_;
      pFVar3 = (this->line_).line_.frame_;
      pBVar4 = (this->line_).line_.line_.line_.canvas_;
      pBVar5 = (this->line_).line_.end_.line_.canvas_;
      pbVar6 = (this->line_).line_.end_.line_.it_._M_current;
      if (pbVar12 == pbVar6 || lVar13 != 0) {
        lVar13 = lVar13 + 1;
      }
      else {
        pbVar12 = pbVar12 + pBVar4->cols_;
      }
      pFVar8 = (this->end_).line_.frame_;
      pVar7 = (this->end_).line_.overflow_;
      pBVar9 = (this->end_).line_.line_.line_.canvas_;
      pbVar10 = (this->end_).line_.line_.line_.it_._M_current;
      pbVar11 = (this->end_).line_.end_.line_.it_._M_current;
      (__return_storage_ptr__->end_).line_.end_.line_.canvas_ =
           (this->end_).line_.end_.line_.canvas_;
      (__return_storage_ptr__->end_).line_.end_.line_.it_._M_current = pbVar11;
      (__return_storage_ptr__->end_).line_.line_.line_.canvas_ = pBVar9;
      (__return_storage_ptr__->end_).line_.line_.line_.it_._M_current = pbVar10;
      (__return_storage_ptr__->end_).line_.frame_ = pFVar8;
      (__return_storage_ptr__->end_).line_.overflow_ = pVar7;
      __return_storage_ptr__->margin_ = pMVar2;
      __return_storage_ptr__->overflow_ = 0;
      (__return_storage_ptr__->line_).line_.frame_ = pFVar3;
      (__return_storage_ptr__->line_).line_.overflow_ = lVar13;
      (__return_storage_ptr__->line_).line_.line_.line_.canvas_ = pBVar4;
      (__return_storage_ptr__->line_).line_.line_.line_.it_._M_current = pbVar12;
      (__return_storage_ptr__->line_).line_.end_.line_.canvas_ = pBVar5;
      (__return_storage_ptr__->line_).line_.end_.line_.it_._M_current = pbVar6;
      return __return_storage_ptr__;
    }
  }
  pMVar2 = this->margin_;
  pbVar12 = (this->line_).line_.end_.line_.it_._M_current;
  (__return_storage_ptr__->line_).line_.end_.line_.canvas_ = (this->line_).line_.end_.line_.canvas_;
  (__return_storage_ptr__->line_).line_.end_.line_.it_._M_current = pbVar12;
  pbVar12 = (this->line_).line_.line_.line_.it_._M_current;
  (__return_storage_ptr__->line_).line_.line_.line_.canvas_ =
       (this->line_).line_.line_.line_.canvas_;
  (__return_storage_ptr__->line_).line_.line_.line_.it_._M_current = pbVar12;
  pVar7 = (this->line_).line_.overflow_;
  (__return_storage_ptr__->line_).line_.frame_ = (this->line_).line_.frame_;
  (__return_storage_ptr__->line_).line_.overflow_ = pVar7;
  pFVar3 = (this->end_).line_.frame_;
  pVar7 = (this->end_).line_.overflow_;
  pbVar12 = (this->end_).line_.line_.line_.it_._M_current;
  pBVar4 = (this->end_).line_.end_.line_.canvas_;
  pbVar6 = (this->end_).line_.end_.line_.it_._M_current;
  (__return_storage_ptr__->end_).line_.line_.line_.canvas_ = (this->end_).line_.line_.line_.canvas_;
  (__return_storage_ptr__->end_).line_.line_.line_.it_._M_current = pbVar12;
  (__return_storage_ptr__->end_).line_.end_.line_.canvas_ = pBVar4;
  (__return_storage_ptr__->end_).line_.end_.line_.it_._M_current = pbVar6;
  (__return_storage_ptr__->end_).line_.frame_ = pFVar3;
  (__return_storage_ptr__->end_).line_.overflow_ = pVar7;
  __return_storage_ptr__->margin_ = pMVar2;
  __return_storage_ptr__->overflow_ = lVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

margin_line next() const {
            return (overflow_ || line_ == end_) ? margin_line(margin_, overflow_ + 1, line_, end_)
                                                : margin_line(margin_, overflow_, std::next(line_), end_);
        }